

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O0

void handleFramePoseOptions(KinDynComputations *comp,parser *cmd)

{
  string *psVar1;
  bool bVar2;
  byte bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  string *in_RSI;
  string *in_RDI;
  Transform referenceFrame_H_name;
  string referenceFrameName;
  string frameName;
  Model *model;
  allocator<char> *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  string *in_stack_fffffffffffffd78;
  parser *in_stack_fffffffffffffd80;
  parser *this;
  string local_1b0 [32];
  string local_190 [88];
  MatrixFixSize<4U,_4U> *in_stack_fffffffffffffec8;
  string local_128 [39];
  undefined1 local_101 [40];
  allocator<char> local_d9;
  string local_d8 [32];
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [32];
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  string *local_18;
  string *local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = (string *)iDynTree::KinDynComputations::getRobotModel();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             (char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  bVar2 = cmdline::parser::exist
                    ((parser *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd08);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    pbVar4 = cmdline::parser::get<std::__cxx11::string>
                       (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    std::__cxx11::string::string(local_70,(string *)pbVar4);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
    std::__cxx11::string::string(local_b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    bVar2 = cmdline::parser::exist
                      ((parser *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                       in_stack_fffffffffffffd08);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    if (bVar2) {
      this = (parser *)local_101;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      pbVar4 = cmdline::parser::get<std::__cxx11::string>(this,local_10);
      std::__cxx11::string::operator=(local_b8,(string *)pbVar4);
      std::__cxx11::string::~string((string *)(local_101 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_101);
    }
    else {
      iDynTree::KinDynComputations::getRobotModel();
      iDynTree::Model::getDefaultBaseLink();
      iDynTree::Model::getFrameName_abi_cxx11_((long)local_128);
      std::__cxx11::string::operator=(local_b8,local_128);
      std::__cxx11::string::~string(local_128);
    }
    psVar1 = local_18;
    iDynTree::Model::getFrameIndex(local_18);
    bVar3 = iDynTree::Model::isValidFrameIndex((long)psVar1);
    psVar1 = local_18;
    if ((bVar3 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Frame ");
      poVar5 = std::operator<<(poVar5,local_70);
      poVar5 = std::operator<<(poVar5," not found in the model");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      iDynTree::Model::getFrameIndex(local_18);
      bVar3 = iDynTree::Model::isValidFrameIndex((long)psVar1);
      if ((bVar3 & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Frame ");
        poVar5 = std::operator<<(poVar5,local_b8);
        poVar5 = std::operator<<(poVar5," not found in the model");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      else {
        iDynTree::KinDynComputations::getRelativeTransform(local_190,local_8);
        poVar5 = std::operator<<((ostream *)&std::cout,local_b8);
        poVar5 = std::operator<<(poVar5,"_H_");
        poVar5 = std::operator<<(poVar5,local_70);
        poVar5 = std::operator<<(poVar5," is \n");
        iDynTree::Transform::asHomogeneousTransform();
        iDynTree::MatrixFixSize<4u,4u>::toString_abi_cxx11_(in_stack_fffffffffffffec8);
        poVar5 = std::operator<<(poVar5,local_1b0);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1b0);
      }
    }
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_70);
  }
  return;
}

Assistant:

void handleFramePoseOptions(iDynTree::KinDynComputations & comp, cmdline::parser & cmd)
{
    using namespace iDynTree;

    const Model & model = comp.getRobotModel();

    if( !cmd.exist("frame-pose") )
    {
        return;
    }

    std::string frameName = cmd.get<std::string>("frame-pose");

    std::string referenceFrameName;
    if( cmd.exist("frame-pose-reference-frame") )
    {
        referenceFrameName = cmd.get<std::string>("frame-pose-reference-frame");
    }
    else
    {
        referenceFrameName = model.getFrameName(comp.getRobotModel().getDefaultBaseLink());
    }

    if( !model.isValidFrameIndex(model.getFrameIndex(frameName)) )
    {
        std::cerr << "Frame " << frameName << " not found in the model" << std::endl;
	return;
    }

    if( !model.isValidFrameIndex(model.getFrameIndex(referenceFrameName)) )
    {
        std::cerr << "Frame " << referenceFrameName << " not found in the model" << std::endl;
	return;
    }

    Transform referenceFrame_H_name = comp.getRelativeTransform(referenceFrameName,frameName);


    std::cout << referenceFrameName << "_H_" << frameName << " is \n" << referenceFrame_H_name.asHomogeneousTransform().toString() << std::endl;
}